

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNA.cpp
# Opt level: O2

unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> __thiscall
Storage::State::SNA::load(SNA *this,string *file_name)

{
  long *plVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint8_t uVar5;
  uint16_t uVar6;
  stat *psVar7;
  State *this_00;
  size_t __nbytes;
  FileHolder file;
  long local_128;
  FileHolder local_120;
  
  FileHolder::FileHolder(&local_120,file_name,ReadWrite);
  psVar7 = FileHolder::stats(&local_120);
  if (psVar7->st_size == 0xc01b) {
    std::make_unique<Analyser::Static::ZXSpectrum::Target>();
    *(undefined4 *)(local_128 + 0x88) = 1;
    this_00 = (State *)operator_new(0xe0);
    Sinclair::ZXSpectrum::State::State(this_00);
    plVar1 = *(long **)(local_128 + 8);
    *(State **)(local_128 + 8) = this_00;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x40))();
    }
    bVar2 = FileHolder::get8(&local_120);
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.hl_dash = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.de_dash = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.bc_dash = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.af_dash = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.hl = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.de = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.bc = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.iy = uVar6;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.ix = uVar6;
    bVar3 = FileHolder::get8(&local_120);
    bVar4 = (bool)(bVar3 >> 2 & 1);
    (this_00->z80).registers.iff2 = bVar4;
    (this_00->z80).registers.iff1 = bVar4;
    bVar3 = FileHolder::get8(&local_120);
    __nbytes = (ulong)bVar2 << 8;
    (this_00->z80).registers.ir = (ushort)bVar3 | (ushort)__nbytes;
    uVar5 = FileHolder::get8(&local_120);
    (this_00->z80).registers.flags = uVar5;
    uVar5 = FileHolder::get8(&local_120);
    (this_00->z80).registers.a = uVar5;
    uVar6 = FileHolder::get16le(&local_120);
    (this_00->z80).registers.stack_pointer = uVar6;
    bVar2 = FileHolder::get8(&local_120);
    (this_00->z80).registers.interrupt_mode = (uint)bVar2;
    uVar5 = FileHolder::get8(&local_120);
    (this_00->video).border_colour = uVar5;
    FileHolder::read((FileHolder *)&stack0xffffffffffffffc8,(int)&local_120,(void *)0xc000,__nbytes)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this_00->ram,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffc8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffc8);
    (this_00->z80).registers.program_counter = 0x1d83;
    *(long *)this = local_128;
  }
  else {
    *(undefined8 *)this = 0;
  }
  FileHolder::~FileHolder(&local_120);
  return (__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
          )(__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Analyser::Static::Target> SNA::load(const std::string &file_name) {
	// Make sure the file is accessible and appropriately sized.
	FileHolder file(file_name);
	if(file.stats().st_size != 48*1024 + 0x1b) {
		return nullptr;
	}

	// SNAs are always for 48kb machines.
	using Target = Analyser::Static::ZXSpectrum::Target;
	auto result = std::make_unique<Target>();
	result->model = Target::Model::FortyEightK;

	// Prepare to populate ZX Spectrum state.
	auto *const state = new Sinclair::ZXSpectrum::State();
	result->state = std::unique_ptr<Reflection::Struct>(state);

	// Comments below: [offset] [contents]

	//	00	I
	const uint8_t i = file.get8();

	//	01	HL';	03	DE';	05	BC';	07	AF'
	state->z80.registers.hl_dash = file.get16le();
	state->z80.registers.de_dash = file.get16le();
	state->z80.registers.bc_dash = file.get16le();
	state->z80.registers.af_dash = file.get16le();

	//	09	HL;		0B	DE;		0D	BC;		0F	IY;		11	IX
	state->z80.registers.hl = file.get16le();
	state->z80.registers.de = file.get16le();
	state->z80.registers.bc = file.get16le();
	state->z80.registers.iy = file.get16le();
	state->z80.registers.ix = file.get16le();

	//	13	IFF2 (in bit 2)
	const uint8_t iff = file.get8();
	state->z80.registers.iff1 = state->z80.registers.iff2 = iff & 4;

	//	14	R
	const uint8_t r = file.get8();
	state->z80.registers.ir = uint16_t((i << 8) | r);

	//	15	AF;		17	SP;		19	interrupt mode
	state->z80.registers.flags = file.get8();
	state->z80.registers.a = file.get8();
	state->z80.registers.stack_pointer = file.get16le();
	state->z80.registers.interrupt_mode = file.get8();

	//	1A	border colour
	state->video.border_colour = file.get8();

	//	1B–	48kb RAM contents
	state->ram = file.read(48*1024);

	// To establish program counter, point it to a RET that
	// I know is in the 16/48kb ROM. This avoids having to
	// try to do a pop here, given that the true program counter
	// might currently be in the ROM.
	state->z80.registers.program_counter = 0x1d83;

	return result;
}